

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerStLoopBodyCount(Lowerer *this,Instr *instr)

{
  uint uVar1;
  intptr_t iVar2;
  Opnd *pOVar3;
  RegOpnd *this_00;
  undefined1 local_40 [8];
  AutoReuseOpnd autoReuse;
  MemRefOpnd *loopBodyCounterOpnd;
  intptr_t header;
  Instr *instr_local;
  Lowerer *this_local;
  
  iVar2 = JITTimeWorkItem::GetLoopHeaderAddr(this->m_func->m_workItem);
  uVar1 = Js::LoopHeader::GetOffsetOfProfiledLoopCounter();
  autoReuse._16_8_ =
       IR::MemRefOpnd::New((void *)(iVar2 + (ulong)uVar1),TyUint32,this->m_func,
                           AddrOpndKindDynamicMisc);
  IR::Instr::SetDst(instr,(Opnd *)autoReuse._16_8_);
  pOVar3 = IR::Instr::GetSrc1(instr);
  this_00 = IR::Opnd::AsRegOpnd(pOVar3);
  pOVar3 = IR::Opnd::UseWithNewType(&this_00->super_Opnd,TyUint32,this->m_func);
  IR::Instr::ReplaceSrc1(instr,pOVar3);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_40,(Opnd *)autoReuse._16_8_,this->m_func,true);
  LowererMD::ChangeToAssign(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_40);
  return;
}

Assistant:

void
Lowerer::LowerStLoopBodyCount(IR::Instr* instr)
{
    intptr_t header = m_func->m_workItem->GetLoopHeaderAddr();

    IR::MemRefOpnd *loopBodyCounterOpnd = IR::MemRefOpnd::New((BYTE*)(header) + Js::LoopHeader::GetOffsetOfProfiledLoopCounter(), TyUint32, this->m_func);
    instr->SetDst(loopBodyCounterOpnd);
    instr->ReplaceSrc1(instr->GetSrc1()->AsRegOpnd()->UseWithNewType(TyUint32, this->m_func));
    IR::AutoReuseOpnd autoReuse(loopBodyCounterOpnd, this->m_func);
    m_lowererMD.ChangeToAssign(instr);
    return;
}